

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

int get_branchlength(uint32_t **pptrptr,int *errcodeptr,int *lcptr,parsed_recurse_check *recurses,
                    compile_block_16 *cb)

{
  parsed_recurse_check *ppVar1;
  BOOL BVar2;
  int iVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint uVar6;
  uint32_t uVar7;
  size_t sVar8;
  int iVar9;
  uint uVar10;
  uint16_t *puVar11;
  char cVar12;
  uint uVar13;
  uint32_t *puVar14;
  uint32_t *pptr;
  parsed_recurse_check this_recurse;
  uint32_t *local_90;
  char local_81;
  parsed_recurse_check *local_80;
  uint32_t *local_78;
  int *local_70;
  size_t local_68;
  int *local_60;
  compile_block_16 *local_58;
  uint32_t *local_50;
  uint32_t **local_48;
  parsed_recurse_check local_40;
  
  local_90 = *pptrptr;
  iVar9 = *lcptr;
  *lcptr = iVar9 + 1;
  if (2000 < iVar9) {
    *errcodeptr = 0x87;
    return -1;
  }
  uVar6 = 0;
  iVar9 = 0;
  local_80 = recurses;
  local_70 = lcptr;
  local_48 = pptrptr;
LAB_001443c6:
  uVar4 = *local_90;
  uVar10 = 1;
  if (-1 < (int)uVar4) goto switchD_0014442b_caseD_8;
  uVar13 = 0;
  uVar10 = 0;
  switch(uVar4 + 0x7fff0000 >> 0x10) {
  case 0:
  case 0x18:
    cVar12 = '\x06';
    goto LAB_001443f6;
  case 1:
  case 0x19:
    goto switchD_0014442b_caseD_1;
  case 2:
    if (((cb->external_options & 0x200) == 0) && ((cb->external_flags & 0x200000) == 0)) {
      uVar10 = uVar4 & 0xffff;
      if (9 < uVar10) goto switchD_0014442b_caseD_1f;
      sVar8 = cb->small_ref_offset[uVar10];
      goto LAB_001447b7;
    }
    goto switchD_0014442b_caseD_a;
  case 3:
    if ((cb->external_options & 0x200) == 0) goto switchD_0014442b_caseD_20;
    goto switchD_0014442b_caseD_a;
  case 4:
    local_90 = local_90 + 1;
  case 0xb:
  case 0x16:
    uVar10 = 1;
    break;
  case 5:
    local_90 = local_90 + 3;
    uVar10 = uVar13;
    break;
  case 6:
    local_90 = local_90 + 5;
    uVar10 = uVar13;
    break;
  case 7:
    uVar13 = uVar4 & 0xffff;
switchD_0014442b_caseD_1:
    local_90 = local_90 + 1;
LAB_0014462a:
    cVar12 = '\x01';
    uVar10 = get_grouplength(&local_90,1,errcodeptr,local_70,uVar13,local_80,cb);
    if (-1 < (int)uVar10) break;
    goto LAB_001443f6;
  case 8:
  case 0x15:
  case 0x28:
  case 0x2a:
  case 0x2c:
  case 0x2e:
    break;
  case 9:
  case 0xd:
    local_90 = parsed_skip(local_90,1);
    uVar10 = 1;
    if (local_90 != (uint32_t *)0x0) break;
    goto LAB_00144860;
  default:
    goto switchD_0014442b_caseD_a;
  case 0xe:
    local_90 = local_90 + 1;
    goto LAB_00144434;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
    local_90 = local_90 + 4;
LAB_00144434:
    uVar13 = 0;
    goto LAB_0014462a;
  case 0x17:
    cVar12 = '\x01';
    if (((short)uVar4 != 0x11) && (uVar4 = uVar4 & 0xffff, uVar4 != 0x16)) {
      if (uVar4 - 6 < 0x11) {
        if ((uVar4 == 0xe) && ((cb->external_options & 0x80000) != 0)) {
          *errcodeptr = 0x88;
          goto LAB_001443f6;
        }
        uVar13 = 1;
        uVar10 = 1;
        if (uVar4 - 0xf < 2) goto switchD_0014442b_caseD_1a;
      }
      break;
    }
    goto LAB_001443f6;
  case 0x1a:
switchD_0014442b_caseD_1a:
    local_90 = local_90 + 1;
    uVar10 = uVar13;
    break;
  case 0x1f:
switchD_0014442b_caseD_1f:
    uVar10 = uVar4 & 0xffff;
    puVar14 = local_90 + 1;
    puVar5 = local_90 + 2;
    local_90 = local_90 + 2;
    sVar8 = CONCAT44(*puVar14,*puVar5);
LAB_001447b7:
    if (uVar10 <= cb->bracount) {
      if (uVar10 != 0) {
        puVar14 = cb->parsed_pattern;
        uVar7 = *puVar14;
        do {
          if ((uVar7 & 0xffff0000) == 0x80050000) {
            puVar14 = puVar14 + 1;
          }
          else if (uVar7 == (uVar10 | 0x80080000)) goto LAB_0014481a;
          uVar7 = puVar14[1];
          puVar14 = puVar14 + 1;
        } while( true );
      }
      goto switchD_0014442b_caseD_a;
    }
    cb->erroroffset = sVar8;
    *errcodeptr = 0x73;
    goto LAB_00144855;
  case 0x20:
switchD_0014442b_caseD_20:
    uVar10 = local_90[1];
    puVar14 = local_90 + 2;
    puVar5 = local_90 + 3;
    local_90 = local_90 + 3;
    sVar8 = CONCAT44(*puVar14,*puVar5);
    local_81 = '\x01';
    local_60 = errcodeptr;
    local_58 = cb;
    if (cb->names_found == 0) {
      uVar10 = 0;
    }
    else {
      local_78 = (uint32_t *)(cb->start_pattern + sVar8);
      puVar11 = &cb->named_groups->isdup;
      uVar13 = 0;
      local_68 = sVar8;
      do {
        if ((uVar10 == puVar11[-1]) &&
           (iVar3 = _pcre2_strncmp_16((PCRE2_SPTR16)local_78,
                                      ((named_group_16 *)(puVar11 + -7))->name,(ulong)uVar10),
           iVar3 == 0)) {
          uVar10 = *(uint *)(puVar11 + -3);
          local_81 = *puVar11 == 0;
          sVar8 = local_68;
          goto LAB_00144751;
        }
        uVar13 = uVar13 + 1;
        puVar11 = puVar11 + 8;
      } while (uVar13 < local_58->names_found);
      uVar10 = 0;
      sVar8 = local_68;
    }
LAB_00144751:
    if (uVar10 == 0) {
      *local_60 = 0x73;
      local_58->erroroffset = sVar8;
      cVar12 = '\x01';
    }
    else {
      cVar12 = '\r';
      if (((uVar4 & 0xffff0000) != 0x80210000) &&
         ((local_81 == '\0' || ((local_58->external_flags & 0x200000) != 0)))) {
        cVar12 = '\0';
      }
    }
    errcodeptr = local_60;
    cb = local_58;
    if (cVar12 == '\0') goto switchD_0014442b_caseD_a;
    if (cVar12 == '\r') goto LAB_001447b7;
    goto LAB_001443f6;
  case 0x21:
  case 0x22:
    local_90 = parsed_skip(local_90 + 1,2);
    if (local_90 == (uint32_t *)0x0) goto LAB_00144860;
    uVar6 = local_90[1] << 0x10 | local_90[1] + 0x7fcf0000 >> 0x10;
    if (uVar6 < 9) {
      local_90 = local_90 + 1;
    }
    else if (uVar6 - 9 < 3) {
      local_90 = local_90 + 3;
    }
    break;
  case 0x23:
  case 0x24:
    BVar2 = set_lookbehind_lengths(&local_90,errcodeptr,local_70,local_80,cb);
    if (BVar2 != 0) break;
    cVar12 = '\x01';
    goto LAB_001443f6;
  case 0x25:
  case 0x29:
  case 0x2b:
  case 0x2d:
  case 0x2f:
    local_90 = local_90 + (local_90[1] + 1);
    break;
  case 0x26:
  case 0x27:
    local_90 = parsed_skip(local_90,0);
    cVar12 = (local_90 == (uint32_t *)0x0) + '\x06';
    goto LAB_001443f6;
  case 0x39:
  case 0x3a:
  case 0x3b:
    uVar7 = local_90[1];
    if (uVar7 != local_90[2]) goto switchD_0014442b_caseD_a;
    local_90 = local_90 + 2;
    uVar4 = 0;
    if (uVar7 == 0) {
      uVar4 = uVar6;
    }
    uVar10 = (uVar7 - 1) * uVar6;
    if (uVar7 == 0) {
      uVar10 = 0;
    }
    iVar9 = iVar9 - uVar4;
  }
  goto switchD_0014442b_caseD_8;
LAB_0014481a:
  local_78 = puVar14 + 1;
  local_50 = puVar14;
  puVar5 = parsed_skip(local_78,2);
  if (puVar5 == (uint32_t *)0x0) {
LAB_00144860:
    cVar12 = '\a';
    goto LAB_001443f6;
  }
  ppVar1 = local_80;
  if (local_90 <= puVar14 || puVar5 <= local_90) {
    for (; ppVar1 != (parsed_recurse_check *)0x0; ppVar1 = ppVar1->prev) {
      if (ppVar1->groupptr == puVar14) goto switchD_0014442b_caseD_a;
    }
    local_40.prev = local_80;
    local_50 = local_78;
    local_40.groupptr = puVar14;
    uVar10 = get_grouplength(&local_50,0,errcodeptr,local_70,uVar10,&local_40,cb);
    if (-1 < (int)uVar10) {
switchD_0014442b_caseD_8:
      iVar9 = iVar9 + uVar10;
      cVar12 = 0xffff < iVar9;
      uVar6 = uVar10;
      if ((bool)cVar12) {
        *errcodeptr = 0xbb;
      }
      goto LAB_001443f6;
    }
    cVar12 = '\x01';
    if (*errcodeptr != 0) goto LAB_001443f6;
  }
switchD_0014442b_caseD_a:
  *errcodeptr = 0x7d;
LAB_00144855:
  cVar12 = '\x01';
LAB_001443f6:
  if (cVar12 != '\0') {
    if (cVar12 == '\x06') {
      *local_48 = local_90;
      if (cb->max_lookbehind < iVar9) {
        cb->max_lookbehind = iVar9;
        return iVar9;
      }
      return iVar9;
    }
    if (cVar12 != '\a') {
      return -1;
    }
    *errcodeptr = 0xbe;
    return -1;
  }
  local_90 = local_90 + 1;
  goto LAB_001443c6;
}

Assistant:

static int
get_branchlength(uint32_t **pptrptr, int *errcodeptr, int *lcptr,
  parsed_recurse_check *recurses, compile_block *cb)
{
int branchlength = 0;
int grouplength;
uint32_t lastitemlength = 0;
uint32_t *pptr = *pptrptr;
PCRE2_SIZE offset;
parsed_recurse_check this_recurse;

/* A large and/or complex regex can take too long to process. This can happen
more often when (?| groups are present in the pattern because their length
cannot be cached. */

if ((*lcptr)++ > 2000)
  {
  *errcodeptr = ERR35;  /* Lookbehind is too complicated */
  return -1;
  }

/* Scan the branch, accumulating the length. */

for (;; pptr++)
  {
  parsed_recurse_check *r;
  uint32_t *gptr, *gptrend;
  uint32_t escape;
  uint32_t group = 0;
  uint32_t itemlength = 0;

  if (*pptr < META_END)
    {
    itemlength = 1;
    }

  else switch (META_CODE(*pptr))
    {
    case META_KET:
    case META_ALT:
    goto EXIT;

    /* (*ACCEPT) and (*FAIL) terminate the branch, but we must skip to the
    actual termination. */

    case META_ACCEPT:
    case META_FAIL:
    pptr = parsed_skip(pptr, PSKIP_ALT);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    goto EXIT;

    case META_MARK:
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1] + 1;
    break;

    case META_CIRCUMFLEX:
    case META_COMMIT:
    case META_DOLLAR:
    case META_PRUNE:
    case META_SKIP:
    case META_THEN:
    break;

    case META_OPTIONS:
    pptr += 1;
    break;

    case META_BIGVALUE:
    itemlength = 1;
    pptr += 1;
    break;

    case META_CLASS:
    case META_CLASS_NOT:
    itemlength = 1;
    pptr = parsed_skip(pptr, PSKIP_CLASS);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;
    break;

    case META_CLASS_EMPTY_NOT:
    case META_DOT:
    itemlength = 1;
    break;

    case META_CALLOUT_NUMBER:
    pptr += 3;
    break;

    case META_CALLOUT_STRING:
    pptr += 3 + SIZEOFFSET;
    break;

    /* Only some escapes consume a character. Of those, \R and \X are never
    allowed because they might match more than character. \C is allowed only in
    32-bit and non-UTF 8/16-bit modes. */

    case META_ESCAPE:
    escape = META_DATA(*pptr);
    if (escape == ESC_R || escape == ESC_X) return -1;
    if (escape > ESC_b && escape < ESC_Z)
      {
#if PCRE2_CODE_UNIT_WIDTH != 32
      if ((cb->external_options & PCRE2_UTF) != 0 && escape == ESC_C)
        {
        *errcodeptr = ERR36;
        return -1;
        }
#endif
      itemlength = 1;
      if (escape == ESC_p || escape == ESC_P) pptr++;  /* Skip prop data */
      }
    break;

    /* Lookaheads can be ignored, but we must start the skip inside the group
    so that it isn't treated as a group within the branch. */

    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    pptr = parsed_skip(pptr + 1, PSKIP_KET);
    if (pptr == NULL) goto PARSED_SKIP_FAILED;

    /* Also ignore any qualifiers that follow a lookahead assertion. */

    switch (pptr[1])
      {
      case META_ASTERISK:
      case META_ASTERISK_PLUS:
      case META_ASTERISK_QUERY:
      case META_PLUS:
      case META_PLUS_PLUS:
      case META_PLUS_QUERY:
      case META_QUERY:
      case META_QUERY_PLUS:
      case META_QUERY_QUERY:
      pptr++;
      break;

      case META_MINMAX:
      case META_MINMAX_PLUS:
      case META_MINMAX_QUERY:
      pptr += 3;
      break;

      default:
      break;
      }
    break;

    /* Lookbehinds can be ignored, but must themselves be checked. */

    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    if (!set_lookbehind_lengths(&pptr, errcodeptr, lcptr, recurses, cb))
      return -1;
    break;

    /* Back references and recursions are handled by very similar code. At this
    stage, the names generated in the parsing pass are available, but the main
    name table has not yet been created. So for the named varieties, scan the
    list of names in order to get the number of the first one in the pattern,
    and whether or not this name is duplicated. */

    case META_BACKREF_BYNAME:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0)
      goto ISNOTFIXED;
    /* Fall through */

    case META_RECURSE_BYNAME:
      {
      int i;
      PCRE2_SPTR name;
      BOOL is_dupname = FALSE;
      named_group *ng = cb->named_groups;
      uint32_t meta_code = META_CODE(*pptr);
      uint32_t length = *(++pptr);

      GETPLUSOFFSET(offset, pptr);
      name = cb->start_pattern + offset;
      for (i = 0; i < cb->names_found; i++, ng++)
        {
        if (length == ng->length && PRIV(strncmp)(name, ng->name, length) == 0)
          {
          group = ng->number;
          is_dupname = ng->isdup;
          break;
          }
        }

      if (group == 0)
        {
        *errcodeptr = ERR15;  /* Non-existent subpattern */
        cb->erroroffset = offset;
        return -1;
        }

      /* A numerical back reference can be fixed length if duplicate capturing
      groups are not being used. A non-duplicate named back reference can also
      be handled. */

      if (meta_code == META_RECURSE_BYNAME ||
          (!is_dupname && (cb->external_flags & PCRE2_DUPCAPUSED) == 0))
        goto RECURSE_OR_BACKREF_LENGTH;  /* Handle as a numbered version. */
      }
    goto ISNOTFIXED;                     /* Duplicate name or number */

    /* The offset values for back references < 10 are in a separate vector
    because otherwise they would use more than two parsed pattern elements on
    64-bit systems. */

    case META_BACKREF:
    if ((cb->external_options & PCRE2_MATCH_UNSET_BACKREF) != 0 ||
        (cb->external_flags & PCRE2_DUPCAPUSED) != 0)
      goto ISNOTFIXED;
    group = META_DATA(*pptr);
    if (group < 10)
      {
      offset = cb->small_ref_offset[group];
      goto RECURSE_OR_BACKREF_LENGTH;
      }

    /* Fall through */
    /* For groups >= 10 - picking up group twice does no harm. */

    /* A true recursion implies not fixed length, but a subroutine call may
    be OK. Back reference "recursions" are also failed. */

    case META_RECURSE:
    group = META_DATA(*pptr);
    GETPLUSOFFSET(offset, pptr);

    RECURSE_OR_BACKREF_LENGTH:
    if (group > cb->bracount)
      {
      cb->erroroffset = offset;
      *errcodeptr = ERR15;  /* Non-existent subpattern */
      return -1;
      }
    if (group == 0) goto ISNOTFIXED;  /* Local recursion */
    for (gptr = cb->parsed_pattern; *gptr != META_END; gptr++)
      {
      if (META_CODE(*gptr) == META_BIGVALUE) gptr++;
        else if (*gptr == (META_CAPTURE | group)) break;
      }

    /* We must start the search for the end of the group at the first meta code
    inside the group. Otherwise it will be treated as an enclosed group. */

    gptrend = parsed_skip(gptr + 1, PSKIP_KET);
    if (gptrend == NULL) goto PARSED_SKIP_FAILED;
    if (pptr > gptr && pptr < gptrend) goto ISNOTFIXED;  /* Local recursion */
    for (r = recurses; r != NULL; r = r->prev) if (r->groupptr == gptr) break;
    if (r != NULL) goto ISNOTFIXED;   /* Mutual recursion */
    this_recurse.prev = recurses;
    this_recurse.groupptr = gptr;

    /* We do not need to know the position of the end of the group, that is,
    gptr is not used after the call to get_grouplength(). Setting the second
    argument FALSE stops it scanning for the end when the length can be found
    in the cache. */

    gptr++;
    grouplength = get_grouplength(&gptr, FALSE, errcodeptr, lcptr, group,
      &this_recurse, cb);
    if (grouplength < 0)
      {
      if (*errcodeptr == 0) goto ISNOTFIXED;
      return -1;  /* Error already set */
      }
    itemlength = grouplength;
    break;

    /* Check nested groups - advance past the initial data for each type and
    then seek a fixed length with get_grouplength(). */

    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_DEFINE:
    pptr += 2 + SIZEOFFSET;
    goto CHECK_GROUP;

    case META_COND_ASSERT:
    pptr += 1;
    goto CHECK_GROUP;

    case META_COND_VERSION:
    pptr += 4;
    goto CHECK_GROUP;

    case META_CAPTURE:
    group = META_DATA(*pptr);
    /* Fall through */

    case META_ATOMIC:
    case META_NOCAPTURE:
    pptr++;
    CHECK_GROUP:
    grouplength = get_grouplength(&pptr, TRUE, errcodeptr, lcptr, group,
      recurses, cb);
    if (grouplength < 0) return -1;
    itemlength = grouplength;
    break;

    /* Exact repetition is OK; variable repetition is not. A repetition of zero
    must subtract the length that has already been added. */

    case META_MINMAX:
    case META_MINMAX_PLUS:
    case META_MINMAX_QUERY:
    if (pptr[1] == pptr[2])
      {
      if (pptr[1] == 0) branchlength -= lastitemlength;
        else itemlength = (pptr[1] - 1) * lastitemlength;
      pptr += 2;
      break;
      }
    /* Fall through */

    /* Any other item means this branch does not have a fixed length. */

    default:
    ISNOTFIXED:
    *errcodeptr = ERR25;   /* Not fixed length */
    return -1;
    }

  /* Add the item length to the branchlength, and save it for use if the next
  thing is a quantifier. */

  branchlength += itemlength;
  lastitemlength = itemlength;

  /* Ensure that the length does not overflow the limit. */

  if (branchlength > LOOKBEHIND_MAX)
    {
    *errcodeptr = ERR87;
    return -1;
    }
  }

EXIT:
*pptrptr = pptr;
if (branchlength > cb->max_lookbehind) cb->max_lookbehind = branchlength;
return branchlength;

PARSED_SKIP_FAILED:
*errcodeptr = ERR90;
return -1;
}